

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O2

void __thiscall StaticSynapse::initialize(StaticSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  ConstantReturnType CStack_38;
  
  iVar1 = (*n_from->_vptr_Population[1])(n_from);
  this->inputSize = iVar1;
  iVar1 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (&CStack_38,(long)this->inputSize,(long)iVar1);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->weights,&CStack_38);
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  return;
}

Assistant:

void StaticSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    weights = Eigen::MatrixXd::Zero(inputSize, outputSize);
    from_population = n_from;
    to_population = n_to;
}